

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O2

boolean get_interesting_appn(j_decompress_ptr cinfo)

{
  byte bVar1;
  int iVar2;
  jpeg_source_mgr *pjVar3;
  boolean bVar4;
  uint uVar5;
  uint uVar6;
  jpeg_error_mgr *pjVar7;
  ulong uVar8;
  ushort uVar9;
  long lVar10;
  ulong uVar11;
  ushort uVar12;
  size_t sVar13;
  byte *pbVar14;
  ulong uVar15;
  JOCTET b [14];
  
  pjVar3 = cinfo->src;
  sVar13 = pjVar3->bytes_in_buffer;
  if (sVar13 == 0) {
    bVar4 = (*pjVar3->fill_input_buffer)(cinfo);
    if (bVar4 == 0) {
      return 0;
    }
    sVar13 = pjVar3->bytes_in_buffer;
  }
  bVar1 = *pjVar3->next_input_byte;
  sVar13 = sVar13 - 1;
  if (sVar13 == 0) {
    bVar4 = (*pjVar3->fill_input_buffer)(cinfo);
    if (bVar4 == 0) {
      return 0;
    }
    pbVar14 = pjVar3->next_input_byte;
    sVar13 = pjVar3->bytes_in_buffer;
  }
  else {
    pbVar14 = pjVar3->next_input_byte + 1;
  }
  uVar11 = (ulong)bVar1 * 0x100;
  uVar8 = uVar11 | *pbVar14;
  lVar10 = uVar11 + *pbVar14 + -2;
  uVar11 = 0;
  uVar5 = (uint)lVar10;
  uVar6 = 0;
  if (2 < uVar8) {
    uVar6 = uVar5;
  }
  uVar15 = 0xe;
  if (uVar8 < 0x10) {
    uVar15 = (ulong)uVar6;
  }
  while( true ) {
    pbVar14 = pbVar14 + 1;
    sVar13 = sVar13 - 1;
    if (uVar15 == uVar11) break;
    if (sVar13 == 0) {
      bVar4 = (*pjVar3->fill_input_buffer)(cinfo);
      if (bVar4 == 0) {
        return 0;
      }
      pbVar14 = pjVar3->next_input_byte;
      sVar13 = pjVar3->bytes_in_buffer;
    }
    b[uVar11] = *pbVar14;
    uVar11 = uVar11 + 1;
  }
  lVar10 = lVar10 - uVar15;
  iVar2 = cinfo->unread_marker;
  uVar6 = (uint)uVar15;
  if (iVar2 == 0xee) {
    if (((0xb < uVar6) && (b._0_4_ == 0x626f6441)) && (b[4] == 'e')) {
      pjVar7 = cinfo->err;
      *(uint *)&pjVar7->msg_parm = (uint)(ushort)(b._5_2_ << 8 | (ushort)b._5_2_ >> 8);
      *(uint *)((long)&pjVar7->msg_parm + 4) =
           (uint)(ushort)(CONCAT11(b[8],b[7]) << 8 | (ushort)b[8]);
      *(uint *)((long)&pjVar7->msg_parm + 8) =
           (uint)(ushort)(CONCAT11(b[10],b[9]) << 8 | (ushort)b[10]);
      *(uint *)((long)&pjVar7->msg_parm + 0xc) = (uint)b[0xb];
      pjVar7->msg_code = 0x4e;
      (*pjVar7->emit_message)((j_common_ptr)cinfo,1);
      cinfo->saw_Adobe_marker = 1;
      cinfo->Adobe_transform = b[0xb];
      goto LAB_00106863;
    }
    pjVar7 = cinfo->err;
    pjVar7->msg_code = 0x50;
    (pjVar7->msg_parm).i[0] = (int)lVar10 + uVar6;
  }
  else {
    if (iVar2 != 0xe0) {
      pjVar7 = cinfo->err;
      pjVar7->msg_code = 0x46;
      (pjVar7->msg_parm).i[0] = iVar2;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      goto LAB_00106863;
    }
    if (uVar6 < 0xe) {
      if (((uVar6 < 6) || (b[0] != 'J')) || (b[1] != 'F')) goto LAB_00106849;
LAB_001067f7:
      if (((b[2] != 'X') || (b[3] != 'X')) || (b[4] != '\0')) goto LAB_00106849;
      pjVar7 = cinfo->err;
      if (b[5] == '\x13') {
        pjVar7->msg_code = 0x70;
      }
      else if (b[5] == '\x11') {
        pjVar7->msg_code = 0x6f;
      }
      else {
        if (b[5] != 0x10) {
          pjVar7->msg_code = 0x5b;
          (pjVar7->msg_parm).i[0] = (uint)b[5];
          (cinfo->err->msg_parm).i[1] = uVar5;
          goto LAB_00106857;
        }
        pjVar7->msg_code = 0x6e;
      }
    }
    else {
      if (b[0] == 'J') {
        if ((b[3] == 'F' && (b[2] == 'I' && b[1] == 'F')) && b[4] == '\0') {
          cinfo->saw_JFIF_marker = 1;
          cinfo->JFIF_major_version = b[5];
          cinfo->JFIF_minor_version = b[6];
          cinfo->density_unit = b[7];
          uVar9 = CONCAT11(b[9],b[8]) << 8 | (ushort)b[9];
          cinfo->X_density = uVar9;
          uVar12 = CONCAT11(b[0xb],b[10]) << 8 | (ushort)b[0xb];
          cinfo->Y_density = uVar12;
          if (b[5] == 1) {
            uVar6 = 1;
          }
          else {
            pjVar7 = cinfo->err;
            pjVar7->msg_code = 0x7a;
            (pjVar7->msg_parm).i[0] = (uint)b[5];
            *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)cinfo->JFIF_minor_version;
            (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
            uVar6 = (uint)cinfo->JFIF_major_version;
            b[6] = cinfo->JFIF_minor_version;
            b[7] = cinfo->density_unit;
            uVar9 = cinfo->X_density;
            uVar12 = cinfo->Y_density;
          }
          pjVar7 = cinfo->err;
          (pjVar7->msg_parm).i[0] = uVar6;
          *(uint *)((long)&pjVar7->msg_parm + 4) = (uint)b[6];
          *(uint *)((long)&pjVar7->msg_parm + 8) = (uint)uVar9;
          *(uint *)((long)&pjVar7->msg_parm + 0xc) = (uint)uVar12;
          *(uint *)((long)&pjVar7->msg_parm + 0x10) = (uint)b[7];
          pjVar7->msg_code = 0x59;
          (*pjVar7->emit_message)((j_common_ptr)cinfo,1);
          if (b[0xd] != '\0' || b[0xc] != '\0') {
            pjVar7 = cinfo->err;
            pjVar7->msg_code = 0x5c;
            *(uint *)&pjVar7->msg_parm = (uint)b[0xc];
            *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)b[0xd];
            (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
          }
          if (uVar8 - 0x10 == (ulong)b[0xd] * (ulong)b[0xc] * 3) goto LAB_00106863;
          pjVar7 = cinfo->err;
          pjVar7->msg_code = 0x5a;
          (pjVar7->msg_parm).i[0] = (int)(uVar8 - 0x10);
          goto LAB_00106857;
        }
        if (b[1] == 'F') goto LAB_001067f7;
      }
LAB_00106849:
      pjVar7 = cinfo->err;
      pjVar7->msg_code = 0x4f;
    }
    (pjVar7->msg_parm).i[0] = uVar5;
  }
LAB_00106857:
  (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
LAB_00106863:
  pjVar3->next_input_byte = pbVar14;
  pjVar3->bytes_in_buffer = sVar13;
  if (0 < lVar10) {
    (*cinfo->src->skip_input_data)(cinfo,lVar10);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
get_interesting_appn (j_decompress_ptr cinfo)
/* Process an APP0 or APP14 marker without saving it */
{
  INT32 length;
  JOCTET b[APPN_DATA_LEN];
  unsigned int i, numtoread;
  INPUT_VARS(cinfo);

  INPUT_2BYTES(cinfo, length, return FALSE);
  length -= 2;

  /* get the interesting part of the marker data */
  if (length >= APPN_DATA_LEN)
    numtoread = APPN_DATA_LEN;
  else if (length > 0)
    numtoread = (unsigned int) length;
  else
    numtoread = 0;
  for (i = 0; i < numtoread; i++)
    INPUT_BYTE(cinfo, b[i], return FALSE);
  length -= numtoread;

  /* process it */
  switch (cinfo->unread_marker) {
  case M_APP0:
    examine_app0(cinfo, (JOCTET FAR *) b, numtoread, length);
    break;
  case M_APP14:
    examine_app14(cinfo, (JOCTET FAR *) b, numtoread, length);
    break;
  default:
    /* can't get here unless jpeg_save_markers chooses wrong processor */
    ERREXIT1(cinfo, JERR_UNKNOWN_MARKER, cinfo->unread_marker);
    break;
  }

  /* skip any remaining data -- could be lots */
  INPUT_SYNC(cinfo);
  if (length > 0)
    (*cinfo->src->skip_input_data) (cinfo, (long) length);

  return TRUE;
}